

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O2

void duckdb::TupleDataStructWithinCollectionScatter
               (Vector *source,TupleDataVectorFormat *source_format,SelectionVector *append_sel,
               idx_t append_count,TupleDataLayout *layout,Vector *row_locations,
               Vector *heap_locations,idx_t param_8,UnifiedVectorFormat *list_data,
               vector<duckdb::TupleDataScatterFunction,_true> *child_functions)

{
  long *plVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  SelectionVector *pSVar4;
  data_ptr_t pdVar5;
  sel_t *psVar6;
  idx_t count;
  byte bVar7;
  bool bVar8;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  const_reference this_00;
  type pVVar9;
  const_reference pvVar10;
  const_reference pvVar11;
  idx_t iVar12;
  idx_t child_i;
  ulong uVar13;
  idx_t struct_col_idx;
  long *plVar14;
  ulong uVar15;
  idx_t iVar16;
  ValidityBytes child_mask;
  
  pSVar2 = list_data->sel;
  pdVar3 = list_data->data;
  pSVar4 = (source_format->unified).sel;
  pdVar5 = heap_locations->data;
  for (iVar16 = 0; iVar16 != append_count; iVar16 = iVar16 + 1) {
    iVar12 = iVar16;
    if (append_sel->sel_vector != (sel_t *)0x0) {
      iVar12 = (idx_t)append_sel->sel_vector[iVar16];
    }
    psVar6 = pSVar2->sel_vector;
    if (psVar6 != (sel_t *)0x0) {
      iVar12 = (idx_t)psVar6[iVar12];
    }
    bVar8 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&(list_data->validity).super_TemplatedValidityMask<unsigned_long>,iVar12);
    if (bVar8) {
      count = *(idx_t *)(pdVar3 + iVar12 * 0x10 + 8);
      if (count != 0) {
        child_mask.validity_mask = *(uchar **)(pdVar5 + iVar16 * 8);
        child_mask.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        child_mask.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        child_mask.capacity = count;
        TemplatedValidityMask<unsigned_char>::SetAllValid(&child_mask,count);
        plVar14 = (long *)(pdVar3 + iVar12 * 0x10);
        uVar15 = plVar14[1];
        plVar1 = (long *)(pdVar5 + iVar16 * 8);
        *plVar1 = *plVar1 + (uVar15 + 7 >> 3);
        for (uVar13 = 0; uVar13 < uVar15; uVar13 = uVar13 + 1) {
          iVar12 = *plVar14 + uVar13;
          psVar6 = pSVar4->sel_vector;
          if (psVar6 != (sel_t *)0x0) {
            iVar12 = (idx_t)psVar6[iVar12];
          }
          bVar8 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (&(source_format->unified).validity.
                              super_TemplatedValidityMask<unsigned_long>,iVar12);
          if (!bVar8) {
            bVar7 = (byte)uVar13 & 7;
            child_mask.validity_mask[uVar13 >> 3] =
                 child_mask.validity_mask[uVar13 >> 3] & (-2 << bVar7 | 0xfeU >> 8 - bVar7);
          }
          uVar15 = plVar14[1];
        }
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&child_mask.validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      }
    }
  }
  this = StructVector::GetEntries(source);
  for (uVar15 = 0;
      uVar15 < (ulong)((long)(this->
                             super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                             ).
                             super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->
                             super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                             ).
                             super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3); uVar15 = uVar15 + 1) {
    this_00 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
              ::get<true>(this,uVar15);
    pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (this_00);
    pvVar10 = vector<duckdb::TupleDataVectorFormat,_true>::get<true>
                        (&source_format->children,uVar15);
    pvVar11 = vector<duckdb::TupleDataScatterFunction,_true>::get<true>(child_functions,uVar15);
    (*pvVar11->function)
              (pVVar9,pvVar10,append_sel,append_count,layout,row_locations,heap_locations,uVar15,
               list_data,&pvVar11->child_functions);
  }
  return;
}

Assistant:

static void TupleDataStructWithinCollectionScatter(const Vector &source, const TupleDataVectorFormat &source_format,
                                                   const SelectionVector &append_sel, const idx_t append_count,
                                                   const TupleDataLayout &layout, const Vector &row_locations,
                                                   Vector &heap_locations, const idx_t,
                                                   const UnifiedVectorFormat &list_data,
                                                   const vector<TupleDataScatterFunction> &child_functions) {
	// Parent list data
	const auto &list_sel = *list_data.sel;
	const auto list_entries = UnifiedVectorFormat::GetData<list_entry_t>(list_data);
	const auto &list_validity = list_data.validity;

	// Source
	const auto &source_data = source_format.unified;
	const auto &source_sel = *source_data.sel;
	const auto &source_validity = source_data.validity;

	// Target
	const auto target_heap_locations = FlatVector::GetData<data_ptr_t>(heap_locations);

	// Initialize the validity of the STRUCTs
	for (idx_t i = 0; i < append_count; i++) {
		const auto list_idx = list_sel.get_index(append_sel.get_index(i));
		if (!list_validity.RowIsValid(list_idx)) {
			continue; // Original list entry is invalid - no need to serialize the child
		}

		// Get the current list entry
		const auto &list_entry = list_entries[list_idx];
		const auto &list_offset = list_entry.offset;
		const auto &list_length = list_entry.length;
		if (list_length == 0) {
			continue;
		}

		// Initialize validity mask and skip the heap pointer over it
		auto &target_heap_location = target_heap_locations[i];
		ValidityBytes child_mask(target_heap_location, list_length);
		child_mask.SetAllValid(list_length);
		target_heap_location += ValidityBytes::SizeInBytes(list_length);

		// Store the validity belonging to this list entry
		for (idx_t child_i = 0; child_i < list_length; child_i++) {
			const auto child_source_idx = source_sel.get_index(list_offset + child_i);
			if (!source_validity.RowIsValid(child_source_idx)) {
				child_mask.SetInvalidUnsafe(child_i);
			}
		}
	}

	// Recurse through the children
	auto &struct_sources = StructVector::GetEntries(source);
	for (idx_t struct_col_idx = 0; struct_col_idx < struct_sources.size(); struct_col_idx++) {
		auto &struct_source = *struct_sources[struct_col_idx];
		auto &struct_format = source_format.children[struct_col_idx];
		const auto &struct_scatter_function = child_functions[struct_col_idx];
		struct_scatter_function.function(struct_source, struct_format, append_sel, append_count, layout, row_locations,
		                                 heap_locations, struct_col_idx, list_data,
		                                 struct_scatter_function.child_functions);
	}
}